

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.hpp
# Opt level: O1

unsigned_long __thiscall
Range<unsigned_long>::get_random_number(Range<unsigned_long> *this,mt19937 *gen)

{
  ulong uVar1;
  result_type_conflict rVar2;
  ulong uVar3;
  unsigned_long __tmp;
  
  uVar3 = this->min;
  uVar1 = this->max;
  if (uVar3 != uVar1) {
    if (uVar1 < uVar3) {
      this->max = uVar3;
      this->min = uVar1;
    }
    rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&this->dist,gen,&(this->dist)._M_param);
    uVar3 = rVar2 * this->step;
  }
  return uVar3;
}

Assistant:

T get_random_number(std::mt19937 &gen) {
    if (min==max) {
      return min;
    } else if (max < min) {
      std::swap(max, min);
    }
    auto number = dist(gen);
    return (step!=1) ? number*step : number;
  }